

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP.cpp
# Opt level: O0

bool __thiscall SRUP_MSG::token(SRUP_MSG *this,uint8_t *t,uint16_t len)

{
  uint8_t *puVar1;
  uint16_t len_local;
  uint8_t *t_local;
  SRUP_MSG *this_local;
  
  if (len == 0) {
    this_local._7_1_ = false;
  }
  else {
    if (this->m_token != (uint8_t *)0x0) {
      operator_delete__(this->m_token);
    }
    puVar1 = (uint8_t *)operator_new__((ulong)len);
    this->m_token = puVar1;
    memcpy(this->m_token,t,(ulong)len);
    this->m_token_len = len;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SRUP_MSG::token(const uint8_t* t, uint16_t len)
{
    try
    {
        if (len < 1)
            return false;
        else
        {
            delete[] m_token;

            m_token = new uint8_t[len];
            std::memcpy(m_token, t, len);
            m_token_len = len;
        }
    }
    catch (...)
    {
        m_token = nullptr;
        return false;
    }

    return true;
}